

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O0

bool __thiscall
helics::PublicationInfo::addSubscriber
          (PublicationInfo *this,GlobalHandle newSubscriber,string_view subscriberName)

{
  bool bVar1;
  GlobalHandle id;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_> *in_RDI;
  SubscriberInformation *sub;
  iterator __end1;
  iterator __begin1;
  vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_> *__range1;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  reference in_stack_ffffffffffffffb8;
  __normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
  local_38;
  pointer *local_30;
  basic_string_view<char,_std::char_traits<char>_> *local_c;
  
  local_30 = &(in_RDI->
              super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_c = in_RSI;
  local_38._M_current =
       (SubscriberInformation *)
       std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::
       begin(in_RDI);
  id = (GlobalHandle)
       std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::
       end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                      ((__normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::vector<helics::SubscriberInformation,std::allocator<helics::SubscriberInformation>>::
      emplace_back<helics::GlobalHandle&,std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                  *)id,&in_stack_ffffffffffffffb8->id,in_stack_ffffffffffffffb0);
      return true;
    }
    in_stack_ffffffffffffffb8 =
         __gnu_cxx::
         __normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
         ::operator*(&local_38);
    in_stack_ffffffffffffffb0 = local_c;
    bVar1 = GlobalHandle::operator==(&in_stack_ffffffffffffffb8->id,id);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
    ::operator++(&local_38);
  }
  return false;
}

Assistant:

bool PublicationInfo::addSubscriber(GlobalHandle newSubscriber, std::string_view subscriberName)
{
    for (auto& sub : subscribers) {
        if (sub.id == newSubscriber) {
            return false;
        }
    }
    subscribers.emplace_back(newSubscriber, subscriberName);
    return true;
}